

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Person.cpp
# Opt level: O1

void __thiscall Person::setAddress(Person *this,Address *address)

{
  std::__cxx11::string::_M_assign((string *)&this->address);
  std::__cxx11::string::_M_assign((string *)&(this->address).city);
  std::__cxx11::string::_M_assign((string *)&(this->address).street);
  return;
}

Assistant:

void Person::setAddress(const Address &address) {

    Person::address = address;
}